

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_multiobj.h
# Opt level: O3

bool __thiscall
mp::
MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::PrepareMOIteration
          (MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,function<mp::sol::Status_()> *get_stt,function<mp::Solution_()> *get_sol)

{
  MOManagerStatus MVar1;
  bool bVar2;
  Error *this_00;
  _Any_data local_50;
  _Manager_type local_40;
  _Any_data local_30;
  _Manager_type local_20;
  
  MVar1 = this->status_;
  if (MVar1 == RUNNING) {
    std::function<mp::sol::Status_()>::function((function<mp::sol::Status_()> *)&local_30,get_stt);
    std::function<mp::Solution_()>::function((function<mp::Solution_()> *)&local_50,get_sol);
    bVar2 = DoPrepareNextMultiobjSolve
                      (this,(function<mp::sol::Status_()> *)&local_30,
                       (function<mp::Solution_()> *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    if (local_20 != (code *)0x0) {
      (*local_20)(&local_30,&local_30,__destroy_functor);
    }
    return bVar2;
  }
  if (MVar1 == NOT_ACTIVE) {
    this_00 = (Error *)__cxa_allocate_exception(0x18);
    Error::Error(this_00,(CStringRef)0x37f4fd,-1);
  }
  else {
    if (MVar1 != NOT_SET) {
      return false;
    }
    this_00 = (Error *)__cxa_allocate_exception(0x18);
    Error::Error(this_00,(CStringRef)0x37f4d3,-1);
  }
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

bool PrepareMOIteration(
      std::function<sol::Status(void)> get_stt, std::function<Solution(void)> get_sol) {
    switch (status_) {
    case MOManagerStatus::NOT_SET:
      MP_RAISE("FlatConverter: MultiobjManager not set up");
    case MOManagerStatus::NOT_ACTIVE:
      MP_RAISE("FlatConverter: MultiobjManager not running");
    case MOManagerStatus::RUNNING:
      return DoPrepareNextMultiobjSolve(get_stt, get_sol);
    case MOManagerStatus::FINISHED:
      return false;
    }
    return false;
  }